

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb.h
# Opt level: O1

ref<immutable::rrb_details::internal_node<int,_false>_> __thiscall
immutable::rrb_details::execute_concat_plan<int,false,6>
          (rrb_details *this,ref<immutable::rrb_details::internal_node<int,_false>_> *all,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *node_size,uint32_t slen,
          uint32_t shift)

{
  size_t __n;
  uint32_t uVar1;
  rrb_size_table<false> *prVar2;
  rrb_size_table<false> *prVar3;
  uint uVar4;
  undefined4 *puVar5;
  internal_node<int,_false> *piVar6;
  char *__function;
  uint uVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  uint uVar13;
  ref<immutable::rrb_details::leaf_node<int,_false>_> new_node;
  ref<immutable::rrb_details::leaf_node<int,_false>_> old;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_88;
  uint local_7c;
  ref<immutable::rrb_details::internal_node<int,_false>_> local_78;
  uint32_t local_6c;
  ref<immutable::rrb_details::internal_node<int,_false>_> *local_68;
  internal_node<int,_false> *local_60;
  ulong local_58;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_50;
  ulong local_48;
  ulong local_40;
  internal_node<int,_false> *local_38;
  
  local_58 = (ulong)slen;
  __n = local_58 * 8;
  local_68 = all;
  local_50 = node_size;
  puVar5 = (undefined4 *)malloc(local_58 * 8 + 0x20);
  puVar5[1] = slen;
  *puVar5 = 1;
  *(undefined8 *)(puVar5 + 4) = 0;
  puVar5[3] = 0;
  *(undefined4 **)(puVar5 + 6) = puVar5 + 8;
  memset(puVar5 + 8,0,__n);
  *(undefined4 **)this = puVar5;
  puVar5[2] = 1;
  if (shift == 6) {
    if (slen != 0) {
      uVar11 = 0;
      uVar12 = 0;
      uVar7 = 0;
      local_6c = 6;
      do {
        if (local_68->ptr == (internal_node<int,_false> *)0x0) {
LAB_0014c648:
          __function = 
          "T *immutable::ref<immutable::rrb_details::internal_node<int, false>>::operator->() const [T = immutable::rrb_details::internal_node<int, false>]"
          ;
LAB_0014c65d:
          __assert_fail("ptr != nullptr",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/janm31415[P]cpp-rrb/test/../immutable/rrb.h"
                        ,0x71a,__function);
        }
        uVar13 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start[uVar11];
        local_78.ptr = local_68->ptr->child[uVar12].ptr;
        if (local_78.ptr != (internal_node<int,_false> *)0x0) {
          (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
        }
        if (uVar7 == 0) {
          if (local_78.ptr == (internal_node<int,_false> *)0x0) {
LAB_0014c667:
            __function = 
            "T *immutable::ref<immutable::rrb_details::leaf_node<int, false>>::operator->() const [T = immutable::rrb_details::leaf_node<int, false>]"
            ;
            goto LAB_0014c65d;
          }
          if (uVar13 != (local_78.ptr)->len) goto LAB_0014c24c;
          if (*(long *)this == 0) goto LAB_0014c648;
          ref<immutable::rrb_details::internal_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,false>> *)
                     (uVar11 * 8 + *(long *)(*(long *)this + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_78);
          uVar12 = (ulong)((int)uVar12 + 1);
          uVar7 = 0;
        }
        else {
LAB_0014c24c:
          piVar6 = (internal_node<int,_false> *)malloc((ulong)uVar13 * 4 + 0x18);
          piVar6->len = uVar13;
          piVar6->type = LEAF_NODE;
          (piVar6->size_table).ptr = (rrb_size_table<false> *)&piVar6->child;
          piVar6->guid = 0;
          if (uVar13 != 0) {
            memset(&piVar6->child,0,(ulong)uVar13 * 4);
          }
          piVar6->_ref_count = 1;
          local_88.ptr = piVar6;
          if (uVar13 != 0) {
            uVar8 = 0;
            do {
              if (local_68->ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c648;
              piVar6 = local_68->ptr->child[uVar12].ptr;
              if (piVar6 == (internal_node<int,_false> *)0x0) goto LAB_0014c667;
              piVar6->_ref_count = piVar6->_ref_count + 1;
              uVar4 = uVar13 - uVar8;
              if (uVar4 < piVar6->len - uVar7) {
                if (uVar13 != uVar8) {
                  if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c667;
                  prVar2 = (piVar6->size_table).ptr;
                  prVar3 = ((local_88.ptr)->size_table).ptr;
                  uVar9 = (ulong)uVar4;
                  uVar10 = uVar7;
                  do {
                    *(undefined4 *)((long)&prVar3->size + (ulong)uVar8 * 4) =
                         *(undefined4 *)((long)&prVar2->size + (ulong)uVar10 * 4);
                    uVar8 = uVar8 + 1;
                    uVar10 = uVar10 + 1;
                    uVar9 = uVar9 - 1;
                  } while (uVar9 != 0);
                }
                uVar7 = uVar7 + uVar4;
                uVar8 = uVar13;
              }
              else {
                uVar4 = piVar6->len - uVar7;
                if (uVar4 != 0) {
                  if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c667;
                  prVar2 = (piVar6->size_table).ptr;
                  prVar3 = ((local_88.ptr)->size_table).ptr;
                  uVar9 = 0;
                  do {
                    *(undefined4 *)((long)&prVar3->size + (ulong)(uVar8 + (int)uVar9) * 4) =
                         *(undefined4 *)((long)&prVar2->size + (ulong)(uVar7 + (int)uVar9) * 4);
                    uVar9 = uVar9 + 1;
                    uVar4 = piVar6->len - uVar7;
                  } while (uVar9 < uVar4);
                }
                uVar8 = uVar4 + uVar8;
                uVar12 = (ulong)((int)uVar12 + 1);
                uVar7 = 0;
              }
              uVar1 = piVar6->_ref_count;
              piVar6->_ref_count = uVar1 - 1;
              if (uVar1 == 1) {
                free(piVar6);
              }
            } while (uVar8 < uVar13);
          }
          if (*(long *)this == 0) goto LAB_0014c648;
          ref<immutable::rrb_details::internal_node<int,false>>::operator=
                    ((ref<immutable::rrb_details::internal_node<int,false>> *)
                     (uVar11 * 8 + *(long *)(*(long *)this + 0x18)),
                     (ref<immutable::rrb_details::leaf_node<int,_false>_> *)&local_88);
          if ((local_88.ptr != (internal_node<int,_false> *)0x0) &&
             (uVar1 = (local_88.ptr)->_ref_count, (local_88.ptr)->_ref_count = uVar1 - 1, uVar1 == 1
             )) {
            free(local_88.ptr);
          }
        }
        if ((local_78.ptr != (internal_node<int,_false> *)0x0) &&
           (uVar1 = (local_78.ptr)->_ref_count, (local_78.ptr)->_ref_count = uVar1 - 1, uVar1 == 1))
        {
          free(local_78.ptr);
        }
        uVar11 = uVar11 + 1;
      } while (uVar11 != local_58);
    }
  }
  else if (slen != 0) {
    local_6c = shift - 6;
    uVar11 = 0;
    local_7c = 0;
    uVar7 = 0;
    local_60 = (internal_node<int,_false> *)this;
    do {
      if (local_68->ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c648;
      uVar13 = (local_50->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar11];
      uVar12 = (ulong)uVar13;
      local_78.ptr = local_68->ptr->child[local_7c].ptr;
      if (local_78.ptr != (internal_node<int,_false> *)0x0) {
        (local_78.ptr)->_ref_count = (local_78.ptr)->_ref_count + 1;
      }
      if (uVar7 == 0) {
        if (local_78.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c648;
        if (uVar13 != (local_78.ptr)->len) goto LAB_0014c480;
        if (*(long *)this == 0) goto LAB_0014c648;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   (uVar11 * 8 + *(long *)(*(long *)this + 0x18)),&local_78);
        local_7c = local_7c + 1;
        uVar7 = 0;
      }
      else {
LAB_0014c480:
        local_40 = uVar11;
        piVar6 = (internal_node<int,_false> *)malloc(uVar12 * 8 + 0x20);
        piVar6->len = uVar13;
        piVar6->type = INTERNAL_NODE;
        (piVar6->size_table).ptr = (rrb_size_table<false> *)0x0;
        piVar6->guid = 0;
        piVar6->child = (ref<immutable::rrb_details::internal_node<int,_false>_> *)(piVar6 + 1);
        uVar13 = 0;
        memset(piVar6 + 1,0,uVar12 * 8);
        piVar6->_ref_count = 1;
        local_88.ptr = piVar6;
        local_48 = uVar12;
        while( true ) {
          this = (rrb_details *)local_60;
          uVar4 = (uint)uVar12;
          uVar8 = uVar4 - uVar13;
          if (uVar4 < uVar13 || uVar8 == 0) break;
          if ((local_68->ptr == (internal_node<int,_false> *)0x0) ||
             (piVar6 = local_68->ptr->child[local_7c].ptr,
             piVar6 == (internal_node<int,_false> *)0x0)) goto LAB_0014c648;
          piVar6->_ref_count = piVar6->_ref_count + 1;
          if (uVar8 < piVar6->len - uVar7) {
            if (uVar4 != uVar13) {
              uVar11 = (ulong)uVar8;
              uVar4 = uVar7;
              do {
                if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c648;
                ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                          ((local_88.ptr)->child + uVar13,piVar6->child + uVar4);
                uVar13 = uVar13 + 1;
                uVar4 = uVar4 + 1;
                uVar11 = uVar11 - 1;
              } while (uVar11 != 0);
            }
            uVar7 = uVar7 + uVar8;
            uVar13 = (uint)local_48;
          }
          else {
            uVar8 = piVar6->len - uVar7;
            if (uVar8 != 0) {
              uVar11 = 0;
              do {
                if (local_88.ptr == (internal_node<int,_false> *)0x0) goto LAB_0014c648;
                ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                          ((local_88.ptr)->child + ((int)uVar11 + uVar13),
                           piVar6->child + (uVar7 + (int)uVar11));
                uVar11 = uVar11 + 1;
                uVar8 = piVar6->len - uVar7;
              } while (uVar11 < uVar8);
            }
            uVar13 = uVar8 + uVar13;
            local_7c = local_7c + 1;
            uVar7 = 0;
          }
          uVar12 = local_48;
          release<int>(piVar6);
        }
        set_sizes<int,false,6>((rrb_details *)&local_38,&local_88,local_6c);
        uVar11 = local_40;
        release<int>(local_38);
        if (*(long *)this == 0) goto LAB_0014c648;
        ref<immutable::rrb_details::internal_node<int,_false>_>::operator=
                  ((ref<immutable::rrb_details::internal_node<int,_false>_> *)
                   (uVar11 * 8 + *(long *)(*(long *)this + 0x18)),&local_88);
        release<int>(local_88.ptr);
      }
      release<int>(local_78.ptr);
      uVar11 = uVar11 + 1;
    } while (uVar11 != local_58);
  }
  return (ref<immutable::rrb_details::internal_node<int,_false>_>)(internal_node<int,_false> *)this;
}

Assistant:

inline ref<internal_node<T, atomic_ref_counting>> execute_concat_plan(const ref<internal_node<T, atomic_ref_counting>>& all, const std::vector<uint32_t>& node_size, uint32_t slen, uint32_t shift)
      {
      // the all vector doesn't have sizes set yet.

      ref<internal_node<T, atomic_ref_counting>> new_all = internal_node_create<T, atomic_ref_counting>(slen);
      // Current old node index to copy from
      uint32_t idx = 0;

      // Offset is how long into the current old node we've already copied from
      uint32_t offset = 0;

      if (shift == bits<N>::rrb_bits)
        { // handle leaf nodes here
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<leaf_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            // just pointer copy the node if there is no offset and both have same
            // size
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<leaf_node<T, atomic_ref_counting>> new_node = leaf_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            // cur_size is the current size of the new node
            // (the amount of elements copied into it so far)

            while (cur_size < new_size /*&& idx < all->len*/)
              {
              // the commented out check is verified by create_concat_plan --
              // otherwise the implementation is erroneous!
              ref<leaf_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                // if this node can contain all elements not copied in the old node,
                // copy all of them into this node

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (old_node->len - offset) * sizeof(T));
                for (uint32_t j = 0; j < old_node->len - offset; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                // if this node can't contain all the elements not copied in the old
                // node, copy as many as we can and pass the old node over to the
                // new node after this one.

                //memcpy(&new_node->child[cur_size], &old_node->child[offset], (new_size - cur_size) * sizeof(T));
                for (uint32_t j = 0; j < new_size - cur_size; ++j)
                  new_node->child[cur_size + j] = old_node->child[offset + j]; // don't memcpy, but use copy constructor

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }

            new_all->child[i] = new_node;
            }
          }
        }
      else
        { // not at lowest non-leaf level
        // this is ALMOST equivalent with the leaf node copying, the only difference
        // is that this is with internal nodes and the fact that they have to create
        // their size tables.

        // As that's the only difference, I won't bother with comments here.
        for (uint32_t i = 0; i < slen; i++)
          {
          const uint32_t new_size = node_size[i];
          ref<internal_node<T, atomic_ref_counting>> old = all->child[idx];

          if (offset == 0 && new_size == old->len)
            {
            idx++;
            new_all->child[i] = old;
            }
          else
            {
            ref<internal_node<T, atomic_ref_counting>> new_node = internal_node_create<T, atomic_ref_counting>(new_size);
            uint32_t cur_size = 0;
            while (cur_size < new_size)
              {
              ref<internal_node<T, atomic_ref_counting>> old_node = all->child[idx];

              if (new_size - cur_size >= old_node->len - offset)
                {
                for (uint32_t k = 0; k < (old_node->len - offset); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                cur_size += old_node->len - offset;
                idx++;
                offset = 0;
                }
              else
                {
                for (uint32_t k = 0; k < (new_size - cur_size); ++k)
                  new_node->child[cur_size + k] = old_node->child[offset + k];

                offset += new_size - cur_size;
                cur_size = new_size;
                }
              }
            set_sizes<T, atomic_ref_counting, N>(new_node, shift - bits<N>::rrb_bits); // This is where we set sizes
            new_all->child[i] = new_node;
            }
          }
        }
      return new_all;
      }